

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

void lzma_mf_hc3_skip(lzma_mf *mf,uint32_t amount)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint32_t cur_match;
  uint32_t hash_2_value;
  uint32_t hash_value;
  uint32_t temp;
  uint32_t pos;
  uint8_t *cur;
  uint32_t amount_local;
  lzma_mf *mf_local;
  
  cur._4_4_ = amount;
  do {
    uVar1 = mf_avail(mf);
    if (uVar1 < 3) {
      move_pending(mf);
    }
    else {
      pbVar5 = mf_ptr(mf);
      uVar2 = mf->read_pos + mf->offset;
      uVar3 = lzma_crc32_table[0][*pbVar5] ^ (uint)pbVar5[1];
      uVar4 = (uVar3 ^ (uint)pbVar5[2] << 8) & mf->hash_mask;
      uVar1 = mf->hash[uVar4 + 0x400];
      mf->hash[uVar3 & 0x3ff] = uVar2;
      mf->hash[uVar4 + 0x400] = uVar2;
      mf->son[mf->cyclic_pos] = uVar1;
      move_pos(mf);
    }
    cur._4_4_ = cur._4_4_ - 1;
  } while (cur._4_4_ != 0);
  return;
}

Assistant:

extern void
lzma_mf_hc3_skip(lzma_mf *mf, uint32_t amount)
{
	do {
		const uint8_t *cur;
		uint32_t pos;
		uint32_t temp, hash_value, hash_2_value; /* hash_3_calc */
		uint32_t cur_match;

		if (mf_avail(mf) < 3) {
			move_pending(mf);
			continue;
		}

		cur = mf_ptr(mf);
		pos = mf->read_pos + mf->offset;

		hash_3_calc();

		cur_match = mf->hash[FIX_3_HASH_SIZE + hash_value];

		mf->hash[hash_2_value] = pos;
		mf->hash[FIX_3_HASH_SIZE + hash_value] = pos;

		hc_skip();

	} while (--amount != 0);
}